

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAcesFile.cpp
# Opt level: O0

void __thiscall
Imf_3_4::AcesInputFile::AcesInputFile(AcesInputFile *this,string *name,int numThreads)

{
  void *pvVar1;
  RgbaInputFile *this_00;
  undefined8 *in_RDI;
  Data *in_stack_00000280;
  char *in_stack_ffffffffffffffa8;
  
  *in_RDI = &PTR__AcesInputFile_002abbc8;
  pvVar1 = operator_new(0x70);
  Data::Data((Data *)0x17310d);
  in_RDI[1] = pvVar1;
  this_00 = (RgbaInputFile *)operator_new(0x40);
  std::__cxx11::string::c_str();
  RgbaInputFile::RgbaInputFile(this_00,in_stack_ffffffffffffffa8,0);
  *(RgbaInputFile **)in_RDI[1] = this_00;
  Data::initColorConversion(in_stack_00000280);
  return;
}

Assistant:

AcesInputFile::AcesInputFile (const std::string& name, int numThreads)
    : _data (new Data)
{
    _data->rgbaFile = new RgbaInputFile (name.c_str (), numThreads);
    _data->initColorConversion ();
}